

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::NegativeInterCellsVerticalLinesProduceNegativeCover
          (VectorRasterizerTests *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cells_container *pcVar5;
  allocator local_1f1;
  string local_1f0 [32];
  LocationInfo local_1d0;
  undefined1 local_1a8 [8];
  cell reference3 [3];
  allocator local_181;
  string local_180 [32];
  LocationInfo local_160;
  undefined1 auStack_138 [8];
  cell reference2 [2];
  LocationInfo local_100;
  undefined1 auStack_d8 [8];
  cell reference1 [6];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(3.0);
  iVar2 = anon_unknown_5::fp(10.1);
  iVar3 = anon_unknown_5::fp(3.0);
  iVar4 = anon_unknown_5::fp(5.0);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  reference1[4].x = -0x100;
  reference1[4].y = 3;
  reference1[4].area = 5;
  reference1[4].cover = 0;
  reference1[5].x = -0x100;
  reference1[2].area = 7;
  reference1[2].cover = 0;
  reference1[3].x = -0x100;
  reference1[3]._2_4_ = 0x60003;
  reference1[3]._6_4_ = 0;
  reference1._8_8_ = 0x80003ff000000;
  reference1._16_8_ = 0x3ff0000000000;
  auStack_d8._0_2_ = 3;
  auStack_d8._2_2_ = 10;
  auStack_d8._4_4_ = 0;
  reference1[0].x = -0x1a;
  reference1[0].y = 3;
  reference1[0].area = 9;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&reference2[1].area + 2),
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)((long)&reference2[1].area + 1));
  ut::LocationInfo::LocationInfo(&local_100,(string *)((long)&reference2[1].area + 2),0x14c);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,6ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [6])auStack_d8,pcVar5,&local_100);
  ut::LocationInfo::~LocationInfo(&local_100);
  std::__cxx11::string::~string((string *)((long)&reference2[1].area + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference2[1].area + 1));
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(23.0);
  iVar2 = anon_unknown_5::fp(19.0);
  iVar3 = anon_unknown_5::fp(23.0);
  iVar4 = anon_unknown_5::fp(17.0);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  auStack_138._0_2_ = 0x17;
  auStack_138._2_2_ = 0x12;
  auStack_138._4_4_ = 0;
  reference2[0].x = -0x100;
  reference2[0].y = 0x17;
  reference2[0].area = 0x11;
  reference2[0].cover = 0;
  reference2[1].x = -0x100;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_181);
  ut::LocationInfo::LocationInfo(&local_160,(string *)local_180,0x15a);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])auStack_138,pcVar5,&local_160);
  ut::LocationInfo::~LocationInfo(&local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  iVar1 = anon_unknown_5::fp(-30001.0);
  iVar2 = anon_unknown_5::fp(-2.8);
  iVar3 = anon_unknown_5::fp(-30001.0);
  iVar4 = anon_unknown_5::fp(-4.71);
  vector_rasterizer::line((vector_rasterizer *)local_88,iVar1,iVar2,iVar3,iVar4);
  reference3[0].cover = 0;
  reference3[1].x = -0x100;
  reference3[1].y = -0x7531;
  reference3[1].area = 0xfffb;
  reference3[1].cover = 0;
  reference3[2].x = -0xb6;
  local_1a8._0_2_ = -0x7531;
  local_1a8._2_2_ = -3;
  local_1a8._4_4_ = 0;
  reference3[0]._0_6_ = 0xfffc8acfffcd;
  reference3[0].area._2_2_ = 0;
  pcVar5 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_1f1);
  ut::LocationInfo::LocationInfo(&local_1d0,(string *)local_1f0,0x169);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_1a8,pcVar5,&local_1d0);
  ut::LocationInfo::~LocationInfo(&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( NegativeInterCellsVerticalLinesProduceNegativeCover )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(3.0), fp(10.1), fp(3.0), fp(5.0));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 3, 10, 0, -26 },
					{ 3, 9, 0, -256 },
					{ 3, 8, 0, -256 },
					{ 3, 7, 0, -256 },
					{ 3, 6, 0, -256 },
					{ 3, 5, 0, -256 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(23.0), fp(19.0), fp(23.0), fp(17.0));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 23, 18, 0, -256 },
					{ 23, 17, 0, -256 },
				};

				assert_equal(reference2, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(-30001.0), fp(-2.8), fp(-30001.0), fp(-4.71));

				// ASSERT
				const vector_rasterizer::cell reference3[] = {
					{ -30001, -3, 0, -51 },
					{ -30001, -4, 0, -256 },
					{ -30001, -5, 0, -182 },
				};

				assert_equal(reference3, vr.cells());
			}